

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_micro.c
# Opt level: O1

VMEMcache *
bench_init(char *path,size_t size,size_t extent_size,vmemcache_repl_p repl_p,uint n_threads,
          context *ctx)

{
  int iVar1;
  VMEMcache *pVVar2;
  VMEMcache *extraout_RAX;
  undefined4 extraout_var;
  undefined4 in_register_0000000c;
  long lVar3;
  long lVar4;
  void *extraout_RDX;
  os_thread_t *thread;
  uint uVar5;
  ulong uVar7;
  ulong uVar8;
  void *arg;
  os_thread_t *thread_00;
  double dVar9;
  benchmark_time_t bStack_90;
  benchmark_time_t bStack_80;
  benchmark_time_t bStack_70;
  os_thread_t oStack_60;
  code *pcStack_40;
  undefined8 uVar6;
  
  lVar4 = CONCAT44(in_register_0000000c,repl_p);
  pcStack_40 = (code *)0x104260;
  pVVar2 = (VMEMcache *)vmemcache_new();
  pcStack_40 = (code *)0x10426e;
  vmemcache_set_size(pVVar2,size);
  pcStack_40 = (code *)0x10427b;
  vmemcache_set_eviction_policy(pVVar2,1);
  pcStack_40 = (code *)0x104286;
  iVar1 = vmemcache_add(pVVar2,path);
  if (iVar1 == 0) {
    if ((int)extent_size != 0) {
      lVar3 = 0;
      do {
        *(VMEMcache **)(lVar4 + 8 + lVar3) = pVVar2;
        *(undefined8 *)(lVar4 + 0x20 + lVar3) = 0;
        lVar3 = lVar3 + 0x30;
      } while ((extent_size & 0xffffffff) * 0x30 != lVar3);
    }
    return pVVar2;
  }
  pcStack_40 = worker_thread_put;
  bench_init_cold_1();
  uVar8 = (ulong)(uint)(*(int *)((long)path + 0x1c) * *(int *)path);
  oStack_60._8_8_ = lVar4;
  oStack_60._16_8_ = pVVar2;
  oStack_60._24_8_ = extent_size & 0xffffffff;
  pcStack_40 = (code *)&stack0xfffffffffffffff8;
  benchmark_time_get(&bStack_70);
  oStack_60.align = uVar8;
  if (*(int *)((long)path + 0x1c) != 0) {
    do {
      uVar6 = *(undefined8 *)((long)path + 8);
      lVar4 = ((ulong)oStack_60.align % (ulong)*(uint *)((long)path + 0x18)) * 0x10;
      thread = &oStack_60;
      iVar1 = vmemcache_put(uVar6,&oStack_60,8,
                            *(undefined8 *)(*(long *)((long)path + 0x10) + 8 + lVar4),
                            *(undefined8 *)(*(long *)((long)path + 0x10) + lVar4));
      uVar5 = (uint)uVar6;
      if (iVar1 != 0) {
        worker_thread_put_cold_1();
        pVVar2 = extraout_RAX;
        if (uVar5 != 0) {
          uVar7 = (ulong)uVar5;
          uVar8 = uVar7;
          arg = extraout_RDX;
          thread_00 = thread;
          do {
            os_thread_create(thread_00,(os_thread_attr_t *)0x0,
                             *(_func_void_ptr_void_ptr **)((long)arg + 0x28),arg);
            thread_00 = thread_00 + 1;
            arg = (void *)((long)arg + 0x30);
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
          do {
            iVar1 = os_thread_join(thread,(void **)0x0);
            pVVar2 = (VMEMcache *)CONCAT44(extraout_var,iVar1);
            thread = thread + 1;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
        return pVVar2;
      }
      oStack_60.align = oStack_60.align + 1;
    } while ((ulong)oStack_60.align < *(uint *)((long)path + 0x1c) + uVar8);
  }
  benchmark_time_get(&bStack_90);
  benchmark_time_diff(&bStack_80,&bStack_70,&bStack_90);
  dVar9 = benchmark_time_get_secs(&bStack_80);
  *(double *)((long)path + 0x20) = dVar9;
  return (VMEMcache *)0x0;
}

Assistant:

static VMEMcache *
bench_init(const char *path, size_t size, size_t extent_size,
		enum vmemcache_repl_p repl_p,
		unsigned n_threads, struct context *ctx)
{
	VMEMcache *cache = vmemcache_new();
	vmemcache_set_size(cache, size);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (vmemcache_add(cache, path))
		UT_FATAL("vmemcache_add: %s (%s)", vmemcache_errormsg(), path);

	for (unsigned i = 0; i < n_threads; ++i) {
		ctx[i].cache = cache;
		ctx[i].secs = 0.0;
	}

	return cache;
}